

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::CoverCrossSyntax::getChild(CoverCrossSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  undefined8 in_RDX;
  long in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff58;
  TokenOrSyntax *in_stack_ffffffffffffff60;
  nullptr_t in_stack_ffffffffffffff68;
  Info *in_stack_ffffffffffffff70;
  
  switch(in_RDX) {
  case 0:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 1:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 2:
    token.info = in_stack_ffffffffffffff70;
    token._0_8_ = in_stack_ffffffffffffff68;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,token);
    break;
  case 3:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 4:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 5:
    token_00.info = in_stack_ffffffffffffff70;
    token_00._0_8_ = in_stack_ffffffffffffff68;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,token_00);
    break;
  case 6:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0xb8),in_stack_ffffffffffffff58);
    break;
  case 7:
    token_01.info = in_stack_ffffffffffffff70;
    token_01._0_8_ = in_stack_ffffffffffffff68;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,token_01);
    break;
  case 8:
    token_02.info = in_stack_ffffffffffffff70;
    token_02._0_8_ = in_stack_ffffffffffffff68;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,token_02);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax
              ((TokenOrSyntax *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax CoverCrossSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return label;
        case 2: return cross;
        case 3: return &items;
        case 4: return iff;
        case 5: return openBrace;
        case 6: return &members;
        case 7: return closeBrace;
        case 8: return emptySemi;
        default: return nullptr;
    }
}